

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

int __thiscall
CVmObjGramProd::getp_addAlt(CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  CVmDynamicCompiler *this_00;
  uint *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmDynamicCompiler *comp;
  CVmGramCompResults results;
  vm_obj_id_t symtab;
  vm_obj_id_t dict;
  vm_obj_id_t match;
  size_t altlen;
  char *altp;
  vm_val_t *alt;
  uint argc;
  vm_val_t *v;
  vm_val_t *in_stack_000006b8;
  vm_obj_id_t in_stack_000006c0;
  vm_obj_id_t in_stack_000006c4;
  vm_obj_id_t in_stack_000006c8;
  int in_stack_000006cc;
  CVmDynamicCompiler *in_stack_000006d0;
  char *in_stack_000006e0;
  size_t in_stack_000006e8;
  CVmDynCompMode in_stack_000006f0;
  CVmDynCompDebug *in_stack_000006f8;
  CVmDynCompResults *in_stack_00000700;
  vm_val_t *in_stack_ffffffffffffff18;
  CVmRun *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  vm_obj_id_t in_stack_ffffffffffffff2c;
  CVmGramCompResults *in_stack_ffffffffffffff30;
  CVmDynCompResults *this_01;
  vm_obj_id_t match_obj;
  uint local_b4;
  undefined1 local_a0 [8];
  int local_98;
  vm_obj_id_t local_6c;
  vm_obj_id_t local_68;
  vm_obj_id_t local_64;
  size_t local_60;
  char *local_58;
  vm_val_t *local_50;
  uint local_34;
  vm_val_t *local_30;
  vm_val_t *local_20;
  vm_obj_id_t local_14;
  int local_4;
  
  if (in_RCX == (uint *)0x0) {
    local_b4 = 0;
  }
  else {
    local_b4 = *in_RCX;
  }
  local_34 = local_b4;
  local_20 = in_RDX;
  local_14 = in_ESI;
  if ((getp_addAlt(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_addAlt(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_addAlt::desc,2,2);
    __cxa_guard_release(&getp_addAlt(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (uint *)in_stack_ffffffffffffff20,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff18);
  if (iVar1 != 0) {
    return 1;
  }
  local_50 = CVmStack::get(0);
  local_58 = vm_val_t::get_as_string(in_stack_ffffffffffffff18);
  if (local_58 == (char *)0x0) {
    err_throw(0);
  }
  local_60 = vmb_get_len((char *)0x3560ca);
  local_58 = local_58 + 2;
  local_64 = 0;
  local_30 = CVmStack::get(1);
  if (local_30->typ == VM_OBJ) {
    local_64 = (local_30->val).obj;
    iVar1 = CVmObjTads::is_tadsobj_obj(0);
    if (iVar1 != 0) {
      local_68 = 0;
      if ((2 < local_34) && (local_30 = CVmStack::get(2), local_30->typ != VM_NIL)) {
        if (local_30->typ == VM_OBJ) {
          local_68 = (local_30->val).obj;
          iVar1 = CVmObjDict::is_dictionary_obj(0);
          if (iVar1 != 0) goto LAB_00356195;
        }
        err_throw(0);
      }
LAB_00356195:
      local_6c = 0;
      if (((3 < local_34) && (local_30 = CVmStack::get(3), local_30->typ != VM_NIL)) &&
         (local_6c = (local_30->val).obj, local_30->typ != VM_OBJ)) {
        err_throw(0);
      }
      CVmRun::push_obj(in_stack_ffffffffffffff20,
                       (vm_obj_id_t)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      CVmGramCompResults::CVmGramCompResults
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 (CVmObjGramProd *)in_stack_ffffffffffffff20,
                 (vm_obj_id_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (vm_obj_id_t)in_stack_ffffffffffffff18);
      this_00 = CVmDynamicCompiler::get();
      match_obj = (vm_obj_id_t)((ulong)local_a0 >> 0x20);
      this_01 = (CVmDynCompResults *)0x0;
      CVmDynamicCompiler::compile
                (in_stack_000006d0,in_stack_000006cc,in_stack_000006c8,in_stack_000006c4,
                 in_stack_000006c0,in_stack_000006b8,in_stack_000006e0,in_stack_000006e8,
                 in_stack_000006f0,in_stack_000006f8,in_stack_00000700);
      if (local_98 != 0) {
        CVmDynCompResults::throw_error(this_01);
      }
      build_alt_props((CVmObjGramProd *)this_00,match_obj);
      CVmStack::discard(local_34 + 1);
      vm_val_t::set_obj(local_20,local_14);
      local_4 = 1;
      CVmGramCompResults::~CVmGramCompResults((CVmGramCompResults *)0x35630a);
      return local_4;
    }
  }
  err_throw(0);
}

Assistant:

int CVmObjGramProd::getp_addAlt(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *oargc)
{
    const vm_val_t *v;
    
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* the first argument is the rule list */
    const vm_val_t *alt = G_stk->get(0);
    const char *altp = alt->get_as_string(vmg0_);
    if (altp == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the source length and buffer pointer */
    size_t altlen = vmb_get_len(altp);
    altp += VMB_LEN;

    /* the next argument is the match object class */
    vm_obj_id_t match = VM_INVALID_OBJ;
    v = G_stk->get(1);
    if (v->typ != VM_OBJ
        || !CVmObjTads::is_tadsobj_obj(vmg_ match = v->val.obj))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* next comes the optional dictionary argument */
    vm_obj_id_t dict = VM_INVALID_OBJ;
    if (argc >= 3
        && (v = G_stk->get(2))->typ != VM_NIL
        && (v->typ != VM_OBJ
            || !CVmObjDict::is_dictionary_obj(vmg_ (dict = v->val.obj))))
        err_throw(VMERR_INVAL_OBJ_TYPE);

    /* next comes the optional symbol table */
    vm_obj_id_t symtab = VM_INVALID_OBJ;
    if (argc >= 4 && (v = G_stk->get(3))->typ != VM_NIL)
    {
        /* get the value, and make sure it's an object */
        symtab = v->val.obj;
        if (v->typ != VM_OBJ)
            err_throw(VMERR_OBJ_VAL_REQD);
    }

    /* push self for gc protection */
    G_interpreter->push_obj(vmg_ self);

    /* dynamically compile the alt list */
    CVmGramCompResults results(self, this, dict, match);
    CVmDynamicCompiler *comp = CVmDynamicCompiler::get(vmg0_);
    comp->compile(vmg_ FALSE, symtab, VM_INVALID_OBJ, VM_INVALID_OBJ,
                  alt, altp, altlen, DCModeGramAlt, 0, &results);

    /* check for errors */
    if (results.err != 0)
        results.throw_error(vmg0_);

    /* rebuild the grammarAltProps property for the match object */
    build_alt_props(vmg_ match);

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* return self */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}